

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::MILSpec::Program_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::_InternalParse(MapEntryImpl<CoreML::Specification::MILSpec::Program_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                 *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  WireType WVar2;
  KeyMapEntryAccessorType *value_00;
  ValueMapEntryAccessorType *value_01;
  ValueMapEntryAccessorType *value;
  KeyMapEntryAccessorType *key;
  ParseContext *pPStack_28;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  MapEntryImpl<CoreML::Specification::MILSpec::Program_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *this_local;
  
  pPStack_28 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  while( true ) {
    bVar1 = ParseContext::Done(pPStack_28,(char **)&ctx_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (char *)ctx_local;
    }
    ctx_local = (ParseContext *)ReadTag((char *)ctx_local,(uint32_t *)((long)&key + 4),0);
    if (ctx_local == (ParseContext *)0x0) break;
    if (key._4_4_ == 10) {
      set_has_key(this);
      value_00 = mutable_key(this);
      ctx_local = (ParseContext *)
                  MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)9,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::Read((char *)ctx_local,pPStack_28,value_00);
      bVar1 = CoreML::Specification::MILSpec::Program_AttributesEntry_DoNotUse::ValidateKey
                        (value_00);
      if (!bVar1) {
        return (char *)0x0;
      }
    }
    else if (key._4_4_ == 0x12) {
      set_has_value(this);
      value_01 = mutable_value(this);
      ctx_local = (ParseContext *)
                  MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)11,_CoreML::Specification::MILSpec::Value>
                  ::Read((char *)ctx_local,pPStack_28,value_01);
      bVar1 = CoreML::Specification::MILSpec::Program_AttributesEntry_DoNotUse::ValidateValue
                        (value_01);
      if (!bVar1) {
        return (char *)0x0;
      }
    }
    else {
      if ((key._4_4_ == 0) ||
         (WVar2 = WireFormatLite::GetTagWireType(key._4_4_), WVar2 == WIRETYPE_END_GROUP)) {
        EpsCopyInputStream::SetLastTag(&pPStack_28->super_EpsCopyInputStream,key._4_4_);
        return (char *)ctx_local;
      }
      ctx_local = (ParseContext *)
                  UnknownFieldParse(key._4_4_,(string *)0x0,(char *)ctx_local,pPStack_28);
    }
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* _InternalParse(const char* ptr, ParseContext* ctx) final {
    while (!ctx->Done(&ptr)) {
      uint32_t tag;
      ptr = ReadTag(ptr, &tag);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      if (tag == kKeyTag) {
        set_has_key();
        KeyMapEntryAccessorType* key = mutable_key();
        ptr = KeyTypeHandler::Read(ptr, ctx, key);
        if (!Derived::ValidateKey(key)) return nullptr;
      } else if (tag == kValueTag) {
        set_has_value();
        ValueMapEntryAccessorType* value = mutable_value();
        ptr = ValueTypeHandler::Read(ptr, ctx, value);
        if (!Derived::ValidateValue(value)) return nullptr;
      } else {
        if (tag == 0 || WireFormatLite::GetTagWireType(tag) ==
                            WireFormatLite::WIRETYPE_END_GROUP) {
          ctx->SetLastTag(tag);
          return ptr;
        }
        ptr = UnknownFieldParse(tag, static_cast<std::string*>(nullptr), ptr,
                                ctx);
      }
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
    return ptr;
  }